

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O2

void __thiscall
QSQLiteDriver::QSQLiteDriver(QSQLiteDriver *this,sqlite3 *connection,QObject *parent)

{
  QSQLiteDriverPrivate *this_00;
  
  this_00 = (QSQLiteDriverPrivate *)operator_new(0xe0);
  QSQLiteDriverPrivate::QSQLiteDriverPrivate(this_00);
  QSqlDriver::QSqlDriver((QSqlDriver *)this,(QSqlDriverPrivate *)this_00,parent);
  *(undefined ***)this = &PTR_metaObject_00227b50;
  *(sqlite3 **)(*(long *)(this + 8) + 0xa8) = connection;
  QSqlDriver::setOpen(SUB81(this,0));
  (**(code **)(*(long *)this + 0x118))(this,0);
  return;
}

Assistant:

QSQLiteDriver::QSQLiteDriver(sqlite3 *connection, QObject *parent)
    : QSqlDriver(*new QSQLiteDriverPrivate, parent)
{
    Q_D(QSQLiteDriver);
    d->access = connection;
    setOpen(true);
    setOpenError(false);
}